

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O0

void __thiscall Exttpose::process_cust(Exttpose *this,int fcnt,fstream *seqfd,fstream *isetfd)

{
  value_type vVar1;
  unsigned_long uVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  int local_38;
  int lit;
  int ii2;
  int ii1;
  int k;
  int j;
  fstream *isetfd_local;
  fstream *seqfd_local;
  int fcnt_local;
  Exttpose *this_local;
  
  for (ii2 = 0; ii2 < fcnt; ii2 = ii2 + 1) {
    for (ii1 = ii2; ii1 < fcnt; ii1 = ii1 + 1) {
      if (this->args->use_seq != 0) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii1);
        pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                           (&this->extary,(long)*pvVar5);
        iVar3 = TransArray::size(pvVar6);
        if (0 < iVar3) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii1);
          pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                             (&this->extary,(long)*pvVar5);
          iVar3 = TransArray::size(pvVar6);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
          pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                             (&this->extary,(long)*pvVar5);
          iVar4 = TransArray::operator[](pvVar6,0);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii1);
          pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                             (&this->extary,(long)*pvVar5);
          iVar3 = TransArray::operator[](pvVar6,iVar3 - 1);
          if (iVar4 < iVar3) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
            iVar3 = *pvVar5;
            uVar2 = this->numfreq;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii1);
            pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&this->seq2,(long)iVar3 * uVar2 + (long)*pvVar5);
            vVar1 = *pvVar7;
            *pvVar7 = vVar1 + '\x01';
            if ((value_type)(vVar1 + '\x01') == '\0') {
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->backidx,(long)*pvVar5);
              std::ostream::write((char *)(seqfd + 0x10),(long)pvVar5);
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii1);
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->backidx,(long)*pvVar5);
              std::ostream::write((char *)(seqfd + 0x10),(long)pvVar5);
            }
          }
        }
      }
      if (ii2 < ii1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
        iVar3 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii1);
        if (iVar3 < *pvVar5) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
          lit = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii1);
          local_38 = *pvVar5;
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
          local_38 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii1);
          lit = *pvVar5;
        }
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->offsets,(long)lit);
        iVar3 = (*pvVar5 - lit) + -1;
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&this->ocust,(long)(iVar3 + local_38));
        if (*pvVar8 == '\x01') {
          pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->itcnt2,(long)(iVar3 + local_38));
          vVar1 = *pvVar7;
          *pvVar7 = vVar1 + '\x01';
          if ((value_type)(vVar1 + '\x01') == '\0') {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->backidx,(long)lit);
            std::ostream::write((char *)(isetfd + 0x10),(long)pvVar5);
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->backidx,(long)local_38);
            std::ostream::write((char *)(isetfd + 0x10),(long)pvVar5);
          }
          pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                             (&this->ocust,(long)(iVar3 + local_38));
          *pvVar8 = '\0';
        }
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
        pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                           (&this->extary,(long)*pvVar5);
        iVar3 = TransArray::size(pvVar6);
        if (0 < iVar3) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
          pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                             (&this->extary,(long)*pvVar5);
          iVar3 = TransArray::size(pvVar6);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii1);
          pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                             (&this->extary,(long)*pvVar5);
          iVar4 = TransArray::operator[](pvVar6,0);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
          pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                             (&this->extary,(long)*pvVar5);
          iVar3 = TransArray::operator[](pvVar6,iVar3 - 1);
          if (iVar4 < iVar3) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii1);
            iVar3 = *pvVar5;
            uVar2 = this->numfreq;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
            pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&this->seq2,(long)iVar3 * uVar2 + (long)*pvVar5);
            vVar1 = *pvVar7;
            *pvVar7 = vVar1 + '\x01';
            if ((value_type)(vVar1 + '\x01') == '\0') {
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii1);
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->backidx,(long)*pvVar5);
              std::ostream::write((char *)(seqfd + 0x10),(long)pvVar5);
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->backidx,(long)*pvVar5);
              std::ostream::write((char *)(seqfd + 0x10),(long)pvVar5);
            }
          }
        }
      }
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->fidx,(long)ii2);
    pvVar6 = std::vector<TransArray,_std::allocator<TransArray>_>::operator[]
                       (&this->extary,(long)*pvVar5);
    TransArray::reset(pvVar6);
  }
  return;
}

Assistant:

void Exttpose::process_cust(int fcnt, fstream &seqfd, fstream &isetfd) {
    int j, k;
    int ii1, ii2, lit;

    for (k = 0; k < fcnt; k++) {
        for (j = k; j < fcnt; j++) {
            if (args.use_seq && extary[fidx[j]].size() > 0) {
                lit = extary[fidx[j]].size() - 1;
                if (extary[fidx[k]][0] < extary[fidx[j]][lit]) {
                    if ((++seq2[fidx[k] * numfreq + fidx[j]]) == 0) {
                        seqfd.write((char *) &backidx[fidx[k]], INT_SIZE);
                        seqfd.write((char *) &backidx[fidx[j]], INT_SIZE);
                    }
                }
            }
            if (j > k) {
                if (fidx[k] < fidx[j]) {
                    ii1 = fidx[k];
                    ii2 = fidx[j];
                } else {
                    ii2 = fidx[k];
                    ii1 = fidx[j];
                }
                lit = offsets[ii1] - ii1 - 1;
                if (ocust[lit + ii2] == 1) {
                    if ((++itcnt2[lit + ii2]) == 0) {
                        isetfd.write((char *) &backidx[ii1], INT_SIZE);
                        isetfd.write((char *) &backidx[ii2], INT_SIZE);
                        //itcnt2[lit+ii2] = 0;
                    }
                    ocust[lit + ii2] = 0;
                }

                if (extary[fidx[k]].size() > 0) {
                    lit = extary[fidx[k]].size() - 1;
                    if (extary[fidx[j]][0] < extary[fidx[k]][lit]) {
                        if ((++seq2[fidx[j] * numfreq + fidx[k]]) == 0) {
                            seqfd.write((char *) &backidx[fidx[j]], INT_SIZE);
                            seqfd.write((char *) &backidx[fidx[k]], INT_SIZE);
                        }
                    }
                }
            }
        }
        extary[fidx[k]].reset();
    }
}